

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O0

void Imf_3_3::anon_unknown_2::checkError(ostream *os)

{
  ulong uVar1;
  int *piVar2;
  ErrnoExc *this;
  long *in_RDI;
  char *in_stack_ffffffffffffffd8;
  
  uVar1 = std::ios::operator!((ios *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  if ((uVar1 & 1) == 0) {
    return;
  }
  piVar2 = __errno_location();
  if (*piVar2 != 0) {
    Iex_3_3::throwErrnoExc();
  }
  this = (ErrnoExc *)__cxa_allocate_exception(0x48);
  Iex_3_3::ErrnoExc::ErrnoExc(this,in_stack_ffffffffffffffd8);
  __cxa_throw(this,&Iex_3_3::ErrnoExc::typeinfo,Iex_3_3::ErrnoExc::~ErrnoExc);
}

Assistant:

void
checkError (ostream& os)
{
    if (!os)
    {
        if (errno) IEX_NAMESPACE::throwErrnoExc ();

        throw IEX_NAMESPACE::ErrnoExc ("File output failed.");
    }
}